

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fScissorTests.cpp
# Opt level: O2

int __thiscall deqp::gles3::Functional::ScissorTests::init(ScissorTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestContext *testCtx;
  RenderContext *renderCtx;
  int extraout_EAX;
  TestNode *pTVar2;
  float *renderArea;
  long lVar3;
  bool bVar4;
  undefined1 local_358 [8];
  undefined8 uStack_350;
  char *local_348;
  char *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  float local_328 [6];
  char *local_310;
  char *local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  char *local_2a0;
  char *local_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  char *local_268;
  char *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  char *local_230;
  char *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  char *local_1f8;
  char *local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  char *local_e0;
  char *local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  char *local_a8;
  char *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  char *local_70;
  char *local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 *local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  testCtx = pCVar1->m_testCtx;
  renderCtx = pCVar1->m_renderCtx;
  renderArea = local_328;
  local_348 = "contained_quads";
  local_340 = "Triangles fully inside scissor area (single call)";
  local_338 = 0x3dcccccd3dcccccd;
  uStack_330 = 0x3f4ccccd3f4ccccd;
  local_328[0] = 0.2;
  local_328[1] = 0.2;
  local_328[2] = 0.6;
  local_328[3] = 0.6;
  local_328[4] = 2.8026e-45;
  local_328[5] = 4.2039e-44;
  local_310 = "partial_quads";
  local_308 = "Triangles partially inside scissor area (single call)";
  local_300 = 0x3e99999a3e99999a;
  uStack_2f8 = 0x3ecccccd3ecccccd;
  local_2f0 = 0x3e4ccccd3e4ccccd;
  uStack_2e8 = 0x3f19999a3f19999a;
  local_2e0 = 0x1e00000002;
  local_2d8 = "contained_tri";
  local_2d0 = "Triangle fully inside scissor area";
  local_2c8 = 0x3dcccccd3dcccccd;
  uStack_2c0 = 0x3f4ccccd3f4ccccd;
  local_2b8 = 0x3e4ccccd3e4ccccd;
  uStack_2b0 = 0x3f19999a3f19999a;
  local_2a8 = 0x100000002;
  local_2a0 = "enclosing_tri";
  local_298 = "Triangle fully covering scissor area";
  local_290 = 0x3ecccccd3ecccccd;
  uStack_288 = 0x3e4ccccd3e4ccccd;
  local_280 = 0x3e4ccccd3e4ccccd;
  uStack_278 = 0x3f19999a3f19999a;
  local_270 = 0x100000002;
  local_268 = "partial_tri";
  local_260 = "Triangle partially inside scissor area";
  local_258 = 0x3ecccccd3ecccccd;
  uStack_250 = 0x3f19999a3f19999a;
  local_248 = 0;
  uStack_240 = 0x3f8000003f800000;
  local_238 = 0x100000002;
  local_230 = "outside_render_tri";
  local_228 = "Triangle with scissor area outside render target";
  local_220 = 0x3fb333333fb33333;
  uStack_218 = 0x3f19999a3f19999a;
  local_210 = 0;
  uStack_208 = 0x3f19999a3f19999a;
  local_200 = 0x100000002;
  local_1f8 = "partial_lines";
  local_1f0 = "Linse partially inside scissor area";
  local_1e8 = 0x3ecccccd3ecccccd;
  uStack_1e0 = 0x3f19999a3f19999a;
  local_1d8 = 0;
  uStack_1d0 = 0x3f8000003f800000;
  local_1c8 = 0x1e00000001;
  local_1c0 = "contained_line";
  local_1b8 = "Line fully inside scissor area";
  local_1b0 = 0x3dcccccd3dcccccd;
  uStack_1a8 = 0x3f4ccccd3f4ccccd;
  local_1a0 = 0x3e4ccccd3e4ccccd;
  uStack_198 = 0x3f19999a3f19999a;
  local_190 = &DAT_100000001;
  local_188 = "partial_line";
  local_180 = "Line partially inside scissor area";
  local_178 = 0x3ecccccd3ecccccd;
  uStack_170 = 0x3f19999a3f19999a;
  local_168 = 0;
  uStack_160 = 0x3f8000003f800000;
  local_158 = &DAT_100000001;
  local_150 = "outside_render_line";
  local_148 = "Line with scissor area outside render target";
  local_140 = 0x3fb333333fb33333;
  uStack_138 = 0x3f19999a3f19999a;
  local_130 = 0;
  uStack_128 = 0x3f19999a3f19999a;
  local_120 = &DAT_100000001;
  local_118 = "contained_point";
  local_110 = "Point fully inside scissor area";
  local_108 = 0x3dcccccd3dcccccd;
  uStack_100 = 0x3f4ccccd3f4ccccd;
  local_f8 = &DAT_3f0000003f000000;
  uStack_f0 = 0;
  local_e8 = 0x100000000;
  local_e0 = "partial_points";
  local_d8 = "Points partially inside scissor area";
  local_d0 = 0x3ecccccd3ecccccd;
  uStack_c8 = 0x3f19999a3f19999a;
  local_c0 = 0;
  uStack_b8 = 0x3f8000003f800000;
  local_b0 = 0x1e00000000;
  local_a8 = "outside_point";
  local_a0 = "Point fully outside scissor area";
  local_98 = 0x3ecccccd3ecccccd;
  uStack_90 = 0x3f19999a3f19999a;
  local_78 = 0x100000000;
  local_88 = 0;
  uStack_80 = 0;
  local_70 = "outside_render_point";
  local_68 = "Point with scissor area outside render target";
  local_60 = 0x3fb333333fb33333;
  uStack_58 = 0x3f19999a3f19999a;
  local_50 = &DAT_3f0000003f000000;
  uStack_48 = 0;
  local_40 = 0x100000000;
  lVar3 = 0xe;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    pTVar2 = deqp::gls::Functional::ScissorTestInternal::createPrimitiveTest
                       (testCtx,renderCtx,*(char **)((Vec4 *)(renderArea + -8))->m_data,
                        *(char **)(renderArea + -6),(Vec4 *)(renderArea + -4),(Vec4 *)renderArea,
                        (PrimitiveType)((Vec4 *)(renderArea + 4))->m_data[0],(int)renderArea[5]);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    renderArea = renderArea + 0xe;
  }
  local_358._0_4_ = 0.1;
  local_358._4_4_ = 0.1;
  uStack_350._0_4_ = 0.8;
  uStack_350._4_4_ = 0.8;
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createClearTest
                     (testCtx,renderCtx,"clear_depth","Depth buffer clear",(Vec4 *)local_358,0x100);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_358._0_4_ = 0.1;
  local_358._4_4_ = 0.1;
  uStack_350._0_4_ = 0.8;
  uStack_350._4_4_ = 0.8;
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createClearTest
                     (testCtx,renderCtx,"clear_stencil","Stencil buffer clear",(Vec4 *)local_358,
                      0x400);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_358._0_4_ = 0.1;
  local_358._4_4_ = 0.1;
  uStack_350._0_4_ = 0.8;
  uStack_350._4_4_ = 0.8;
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createClearTest
                     (testCtx,renderCtx,"clear_color","Color buffer clear",(Vec4 *)local_358,0x4000)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
                     (testCtx,renderCtx,"clear_fixed_buffer","Fixed point color clear",
                      CLEAR_COLOR_FIXED);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
                     (testCtx,renderCtx,"clear_int_buffer","Integer color clear",CLEAR_COLOR_INT);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
                     (testCtx,renderCtx,"clear_uint_buffer","Unsigned integer buffer clear",
                      CLEAR_COLOR_UINT);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
                     (testCtx,renderCtx,"clear_depth_buffer","Depth buffer clear",CLEAR_DEPTH);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
                     (testCtx,renderCtx,"clear_stencil_buffer","Stencil buffer clear",CLEAR_STENCIL)
  ;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
                     (testCtx,renderCtx,"clear_depth_stencil_buffer",
                      "Fixed point color buffer clear",CLEAR_DEPTH_STENCIL);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_358._0_4_ = 0.1;
  local_358._4_4_ = 0.1;
  uStack_350._0_4_ = 0.8;
  uStack_350._4_4_ = 0.8;
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createFramebufferBlitTest
                     (testCtx,renderCtx,"framebuffer_blit_center",
                      "Blit to default framebuffer, scissor away edges",(Vec4 *)local_358);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_358._0_4_ = 0.6;
  local_358._4_4_ = 0.6;
  uStack_350 = &DAT_3f0000003f000000;
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createFramebufferBlitTest
                     (testCtx,renderCtx,"framebuffer_blit_corner",
                      "Blit to default framebuffer, scissor all but a corner",(Vec4 *)local_358);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_358._0_4_ = 1.6;
  local_358._4_4_ = 0.6;
  uStack_350 = &DAT_3f0000003f000000;
  pTVar2 = deqp::gls::Functional::ScissorTestInternal::createFramebufferBlitTest
                     (testCtx,renderCtx,"framebuffer_blit_none",
                      "Blit to default framebuffer, scissor area outside screen",(Vec4 *)local_358);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void ScissorTests::init (void)
{
	using tcu::Vec4;
	using namespace gls::Functional::ScissorTestInternal;

	tcu::TestContext&		tc = m_context.getTestContext();
	glu::RenderContext&		rc = m_context.getRenderContext();

	const struct
	{
		const char*			name;
		const char*			desc;
		const tcu::Vec4		scissor;
		const tcu::Vec4		render;
		const PrimitiveType	type;
		const int			primitives;
	} cases[] =
	{
		{ "contained_quads",		"Triangles fully inside scissor area (single call)",		Vec4(0.1f, 0.1f, 0.8f, 0.8f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), TRIANGLE,	30 },
		{ "partial_quads",			"Triangles partially inside scissor area (single call)",	Vec4(0.3f, 0.3f, 0.4f, 0.4f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), TRIANGLE,	30 },
		{ "contained_tri",			"Triangle fully inside scissor area",						Vec4(0.1f, 0.1f, 0.8f, 0.8f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), TRIANGLE,	1  },
		{ "enclosing_tri",			"Triangle fully covering scissor area",						Vec4(0.4f, 0.4f, 0.2f, 0.2f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), TRIANGLE,	1  },
		{ "partial_tri",			"Triangle partially inside scissor area",					Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 1.0f, 1.0f), TRIANGLE,	1  },
		{ "outside_render_tri",		"Triangle with scissor area outside render target",			Vec4(1.4f, 1.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 0.6f, 0.6f), TRIANGLE,	1  },
		{ "partial_lines",			"Linse partially inside scissor area",						Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 1.0f, 1.0f), LINE,		30 },
		{ "contained_line",			"Line fully inside scissor area",							Vec4(0.1f, 0.1f, 0.8f, 0.8f), Vec4(0.2f, 0.2f, 0.6f, 0.6f), LINE,		1  },
		{ "partial_line",			"Line partially inside scissor area",						Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 1.0f, 1.0f), LINE,		1  },
		{ "outside_render_line",	"Line with scissor area outside render target",				Vec4(1.4f, 1.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 0.6f, 0.6f), LINE,		1  },
		{ "contained_point",		"Point fully inside scissor area",							Vec4(0.1f, 0.1f, 0.8f, 0.8f), Vec4(0.5f, 0.5f, 0.0f, 0.0f), POINT,		1  },
		{ "partial_points",			"Points partially inside scissor area",						Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 1.0f, 1.0f), POINT,		30 },
		{ "outside_point",			"Point fully outside scissor area",							Vec4(0.4f, 0.4f, 0.6f, 0.6f), Vec4(0.0f, 0.0f, 0.0f, 0.0f), POINT,		1  },
		{ "outside_render_point",	"Point with scissor area outside render target",			Vec4(1.4f, 1.4f, 0.6f, 0.6f), Vec4(0.5f, 0.5f, 0.0f, 0.0f),	POINT,		1  }
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
	{
		addChild(createPrimitiveTest(tc,
									 rc,
									 cases[caseNdx].name,
									 cases[caseNdx].desc,
									 cases[caseNdx].scissor,
									 cases[caseNdx].render,
									 cases[caseNdx].type,
									 cases[caseNdx].primitives));
	}

	addChild(createClearTest(tc, rc, "clear_depth",		"Depth buffer clear",	Vec4(0.1f, 0.1f, 0.8f, 0.8f), GL_DEPTH_BUFFER_BIT));
	addChild(createClearTest(tc, rc, "clear_stencil",	"Stencil buffer clear",	Vec4(0.1f, 0.1f, 0.8f, 0.8f), GL_STENCIL_BUFFER_BIT));
	addChild(createClearTest(tc, rc, "clear_color",		"Color buffer clear",	Vec4(0.1f, 0.1f, 0.8f, 0.8f), GL_COLOR_BUFFER_BIT));

	addChild(createFramebufferClearTest(tc, rc, "clear_fixed_buffer",			"Fixed point color clear",			CLEAR_COLOR_FIXED));
	addChild(createFramebufferClearTest(tc, rc, "clear_int_buffer",				"Integer color clear",				CLEAR_COLOR_INT));
	addChild(createFramebufferClearTest(tc, rc, "clear_uint_buffer",			"Unsigned integer buffer clear",	CLEAR_COLOR_UINT));
	addChild(createFramebufferClearTest(tc, rc, "clear_depth_buffer",			"Depth buffer clear",				CLEAR_DEPTH));
	addChild(createFramebufferClearTest(tc, rc, "clear_stencil_buffer",			"Stencil buffer clear",				CLEAR_STENCIL));
	addChild(createFramebufferClearTest(tc, rc, "clear_depth_stencil_buffer",	"Fixed point color buffer clear",	CLEAR_DEPTH_STENCIL));

	addChild(createFramebufferBlitTest(tc, rc, "framebuffer_blit_center",	"Blit to default framebuffer, scissor away edges",			Vec4(0.1f, 0.1f, 0.8f, 0.8f)));
	addChild(createFramebufferBlitTest(tc, rc, "framebuffer_blit_corner",	"Blit to default framebuffer, scissor all but a corner",	Vec4(0.6f, 0.6f, 0.5f, 0.5f)));
	addChild(createFramebufferBlitTest(tc, rc, "framebuffer_blit_none",		"Blit to default framebuffer, scissor area outside screen", Vec4(1.6f, 0.6f, 0.5f, 0.5f)));
}